

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O2

double chatra::emb::math::getDouble(Ct *ct,size_t index)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  IllegalArgumentException *this;
  double dVar4;
  
  iVar2 = (*ct->_vptr_NativeCallContext[10])();
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,index);
  lVar3 = *(long *)CONCAT44(extraout_var_00,iVar2);
  if (cVar1 != '\0') {
    lVar3 = (**(code **)(lVar3 + 0x58))();
    return (double)lVar3;
  }
  cVar1 = (**(code **)(lVar3 + 0x28))((long *)CONCAT44(extraout_var_00,iVar2));
  if (cVar1 != '\0') {
    iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,index);
    dVar4 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x60))
                              ((long *)CONCAT44(extraout_var_01,iVar2));
    return dVar4;
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  IllegalArgumentException::IllegalArgumentException
            (this,"passing argument #%zu has non-numeric value",index);
  __cxa_throw(this,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

static double getDouble(Ct& ct, size_t index = 0) {
	if (ct[index].isInt())
		return static_cast<double>(ct[index].getInt());
	if (ct[index].isFloat())
		return ct[index].getFloat();
	throw IllegalArgumentException("passing argument #%zu has non-numeric value", index);
}